

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_x86_mov64FromMemoryWithOffset
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,
               sysbvm_x86_register_t source,int32_t offset)

{
  undefined1 uVar1;
  undefined8 in_RAX;
  undefined1 uVar2;
  undefined1 uVar3;
  byte bVar4;
  size_t sStack_10;
  uint8_t instruction [4];
  undefined4 local_4;
  
  bVar4 = (byte)destination;
  stack0xfffffffffffffffb = (undefined5)((ulong)in_RAX >> 0x18);
  if (source == SYSBVM_X86_EBP || offset != 0) {
    uVar3 = (undefined1)((uint)offset >> 8);
    uVar2 = (undefined1)((uint)offset >> 0x18);
    uVar1 = (undefined1)((uint)offset >> 0x10);
    if ((source & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
      instruction._0_3_ = CONCAT12((bVar4 & 7) << 3,0x8b48) | 0x840000;
      instruction = (uint8_t  [4])CONCAT13('$',instruction._0_3_);
      _instruction = CONCAT17(uVar2,CONCAT16(uVar1,CONCAT15(uVar3,CONCAT14((char)offset,instruction)
                                                           )));
      sStack_10 = 8;
    }
    else {
      local_4._3_1_ = (undefined1)((ulong)in_RAX >> 0x38);
      _instruction = CONCAT17(local_4._3_1_,
                              CONCAT16(uVar2,CONCAT15(uVar1,CONCAT14(uVar3,CONCAT13((char)offset,
                                                                                    CONCAT12((bVar4 
                                                  & 7) << 3 | (byte)source & 7,0x8b48)))))) |
                     0x800000;
      sStack_10 = 7;
    }
  }
  else if ((source & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
    instruction._0_3_ = CONCAT12((bVar4 & 7) << 3,0x8b48) | 0x40000;
    local_4 = (undefined4)((ulong)in_RAX >> 0x20);
    instruction = (uint8_t  [4])CONCAT13('$',instruction._0_3_);
    sStack_10 = 4;
  }
  else {
    instruction._0_3_ = CONCAT12((bVar4 & 7) << 3 | (byte)source & 7,0x8b48);
    sStack_10 = 3;
  }
  sysbvm_bytecodeJit_addBytes(jit,sStack_10,instruction);
  return;
}

Assistant:

static void sysbvm_jit_x86_mov64FromMemoryWithOffset(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, sysbvm_x86_register_t source, int32_t offset)
{
    if(offset == 0 && source != SYSBVM_X86_RBP)
    {
        if((source & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 0),
                sysbvm_jit_x86_sibOnlyBase(source),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 0),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
    else
    {
        if((source & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 2),
                sysbvm_jit_x86_sibOnlyBase(source),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 2),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
}